

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

DOHcode doh_resp_decode(uchar *doh,size_t dohlen,DNStype dnstype,dohentry *d)

{
  unsigned_short uVar1;
  DOHcode DVar2;
  uint uVar3;
  uint ttl;
  uint uStack_44;
  unsigned_short class;
  DOHcode rc;
  uint index;
  unsigned_short local_38;
  unsigned_short arcount;
  unsigned_short nscount;
  unsigned_short rdlength;
  unsigned_short type;
  unsigned_short ancount;
  unsigned_short qdcount;
  uchar rcode;
  dohentry *d_local;
  size_t sStack_20;
  DNStype dnstype_local;
  size_t dohlen_local;
  uchar *doh_local;
  
  local_38 = 0;
  uStack_44 = 0xc;
  if (dohlen < 0xc) {
    doh_local._4_4_ = DOH_TOO_SMALL_BUFFER;
  }
  else if (((doh == (uchar *)0x0) || (*doh != '\0')) || (doh[1] != '\0')) {
    doh_local._4_4_ = DOH_DNS_BAD_ID;
  }
  else {
    rdlength._1_1_ = doh[3] & 0xf;
    if (rdlength._1_1_ == 0) {
      _type = d;
      d_local._4_4_ = dnstype;
      sStack_20 = dohlen;
      dohlen_local = (size_t)doh;
      for (nscount = doh_get16bit(doh,4); nscount != 0; nscount = nscount - 1) {
        DVar2 = doh_skipqname((uchar *)dohlen_local,sStack_20,&stack0xffffffffffffffbc);
        if (DVar2 != DOH_OK) {
          return DVar2;
        }
        if (sStack_20 < uStack_44 + 4) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uStack_44 = uStack_44 + 4;
      }
      for (arcount = doh_get16bit((uchar *)dohlen_local,6); arcount != 0; arcount = arcount - 1) {
        DVar2 = doh_skipqname((uchar *)dohlen_local,sStack_20,&stack0xffffffffffffffbc);
        if (DVar2 != DOH_OK) {
          return DVar2;
        }
        if (sStack_20 < uStack_44 + 2) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        local_38 = doh_get16bit((uchar *)dohlen_local,uStack_44);
        if (((local_38 != 5) && (local_38 != 0x27)) && (local_38 != d_local._4_4_)) {
          return DOH_DNS_UNEXPECTED_TYPE;
        }
        uVar3 = uStack_44 + 2;
        if (sStack_20 < uStack_44 + 4) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uStack_44 = uVar3;
        uVar1 = doh_get16bit((uchar *)dohlen_local,uVar3);
        if (uVar1 != 1) {
          return DOH_DNS_UNEXPECTED_CLASS;
        }
        uVar3 = uStack_44 + 2;
        if (sStack_20 < uStack_44 + 6) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uStack_44 = uVar3;
        uVar3 = doh_get32bit((uchar *)dohlen_local,uVar3);
        if (uVar3 < _type->ttl) {
          _type->ttl = uVar3;
        }
        uVar3 = uStack_44 + 4;
        if (sStack_20 < uStack_44 + 6) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uStack_44 = uVar3;
        index._2_2_ = doh_get16bit((uchar *)dohlen_local,uVar3);
        uStack_44 = uStack_44 + 2;
        if (sStack_20 < uStack_44 + index._2_2_) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        DVar2 = doh_rdata((uchar *)dohlen_local,sStack_20,index._2_2_,local_38,uStack_44,_type);
        if (DVar2 != DOH_OK) {
          return DVar2;
        }
        uStack_44 = index._2_2_ + uStack_44;
      }
      for (index._0_2_ = doh_get16bit((uchar *)dohlen_local,8); (unsigned_short)index != 0;
          index._0_2_ = (unsigned_short)index - 1) {
        DVar2 = doh_skipqname((uchar *)dohlen_local,sStack_20,&stack0xffffffffffffffbc);
        if (DVar2 != DOH_OK) {
          return DVar2;
        }
        if (sStack_20 < uStack_44 + 8) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uVar3 = uStack_44 + 8;
        if (sStack_20 < uStack_44 + 10) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uStack_44 = uVar3;
        index._2_2_ = doh_get16bit((uchar *)dohlen_local,uVar3);
        if (sStack_20 < uStack_44 + 2 + (uint)index._2_2_) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uStack_44 = (uint)index._2_2_ + uStack_44 + 2;
      }
      for (rc._2_2_ = doh_get16bit((uchar *)dohlen_local,10); rc._2_2_ != DOH_OK >> 0x10;
          rc._2_2_ = rc._2_2_ + 0xffff) {
        DVar2 = doh_skipqname((uchar *)dohlen_local,sStack_20,&stack0xffffffffffffffbc);
        if (DVar2 != DOH_OK) {
          return DVar2;
        }
        if (sStack_20 < uStack_44 + 8) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uVar3 = uStack_44 + 8;
        if (sStack_20 < uStack_44 + 10) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uStack_44 = uVar3;
        index._2_2_ = doh_get16bit((uchar *)dohlen_local,uVar3);
        if (sStack_20 < uStack_44 + 2 + (uint)index._2_2_) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        uStack_44 = (uint)index._2_2_ + uStack_44 + 2;
      }
      if (uStack_44 == sStack_20) {
        if (((local_38 == 2) || (_type->numcname != 0)) || (_type->numaddr != 0)) {
          doh_local._4_4_ = DOH_OK;
        }
        else {
          doh_local._4_4_ = DOH_NO_CONTENT;
        }
      }
      else {
        doh_local._4_4_ = DOH_DNS_MALFORMAT;
      }
    }
    else {
      doh_local._4_4_ = DOH_DNS_BAD_RCODE;
    }
  }
  return doh_local._4_4_;
}

Assistant:

UNITTEST DOHcode doh_resp_decode(const unsigned char *doh,
                                 size_t dohlen,
                                 DNStype dnstype,
                                 struct dohentry *d)
{
  unsigned char rcode;
  unsigned short qdcount;
  unsigned short ancount;
  unsigned short type = 0;
  unsigned short rdlength;
  unsigned short nscount;
  unsigned short arcount;
  unsigned int index = 12;
  DOHcode rc;

  if(dohlen < 12)
    return DOH_TOO_SMALL_BUFFER; /* too small */
  if(!doh || doh[0] || doh[1])
    return DOH_DNS_BAD_ID; /* bad ID */
  rcode = doh[3] & 0x0f;
  if(rcode)
    return DOH_DNS_BAD_RCODE; /* bad rcode */

  qdcount = doh_get16bit(doh, 4);
  while(qdcount) {
    rc = doh_skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */
    if(dohlen < (index + 4))
      return DOH_DNS_OUT_OF_RANGE;
    index += 4; /* skip question's type and class */
    qdcount--;
  }

  ancount = doh_get16bit(doh, 6);
  while(ancount) {
    unsigned short class;
    unsigned int ttl;

    rc = doh_skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    type = doh_get16bit(doh, index);
    if((type != DNS_TYPE_CNAME)    /* may be synthesized from DNAME */
       && (type != DNS_TYPE_DNAME) /* if present, accept and ignore */
       && (type != dnstype))
      /* Not the same type as was asked for nor CNAME nor DNAME */
      return DOH_DNS_UNEXPECTED_TYPE;
    index += 2;

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;
    class = doh_get16bit(doh, index);
    if(DNS_CLASS_IN != class)
      return DOH_DNS_UNEXPECTED_CLASS; /* unsupported */
    index += 2;

    if(dohlen < (index + 4))
      return DOH_DNS_OUT_OF_RANGE;

    ttl = doh_get32bit(doh, index);
    if(ttl < d->ttl)
      d->ttl = ttl;
    index += 4;

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = doh_get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;

    rc = doh_rdata(doh, dohlen, rdlength, type, (int)index, d);
    if(rc)
      return rc; /* bad doh_rdata */
    index += rdlength;
    ancount--;
  }

  nscount = doh_get16bit(doh, 8);
  while(nscount) {
    rc = doh_skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 8))
      return DOH_DNS_OUT_OF_RANGE;

    index += 2 + 2 + 4; /* type, class and ttl */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = doh_get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;
    index += rdlength;
    nscount--;
  }

  arcount = doh_get16bit(doh, 10);
  while(arcount) {
    rc = doh_skipqname(doh, dohlen, &index);
    if(rc)
      return rc; /* bad qname */

    if(dohlen < (index + 8))
      return DOH_DNS_OUT_OF_RANGE;

    index += 2 + 2 + 4; /* type, class and ttl */

    if(dohlen < (index + 2))
      return DOH_DNS_OUT_OF_RANGE;

    rdlength = doh_get16bit(doh, index);
    index += 2;
    if(dohlen < (index + rdlength))
      return DOH_DNS_OUT_OF_RANGE;
    index += rdlength;
    arcount--;
  }

  if(index != dohlen)
    return DOH_DNS_MALFORMAT; /* something is wrong */

#ifdef USE_HTTTPS
  if((type != DNS_TYPE_NS) && !d->numcname && !d->numaddr && !d->numhttps_rrs)
#else
  if((type != DNS_TYPE_NS) && !d->numcname && !d->numaddr)
#endif
    /* nothing stored! */
    return DOH_NO_CONTENT;

  return DOH_OK; /* ok */
}